

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_perform_fetch(connectdata *conn)

{
  void *pvVar1;
  long lVar2;
  CURLcode CVar3;
  char *pcVar4;
  
  pvVar1 = (conn->data->req).protop;
  lVar2 = *(long *)((long)pvVar1 + 0x18);
  if (lVar2 == 0) {
    Curl_failf(conn->data,"Cannot FETCH without a UID.");
    CVar3 = CURLE_URL_MALFORMAT;
  }
  else {
    pcVar4 = "";
    if (*(char **)((long)pvVar1 + 0x20) != (char *)0x0) {
      pcVar4 = *(char **)((long)pvVar1 + 0x20);
    }
    if (*(long *)((long)pvVar1 + 0x28) == 0) {
      CVar3 = imap_sendf(conn,"FETCH %s BODY[%s]",lVar2,pcVar4);
    }
    else {
      CVar3 = imap_sendf(conn,"FETCH %s BODY[%s]<%s>",lVar2,pcVar4);
    }
    if (CVar3 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_FETCH;
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode imap_perform_fetch(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = conn->data->req.protop;

  /* Check we have a UID */
  if(!imap->uid) {
    failf(conn->data, "Cannot FETCH without a UID.");
    return CURLE_URL_MALFORMAT;
  }

  /* Send the FETCH command */
  if(imap->partial)
    result = imap_sendf(conn, "FETCH %s BODY[%s]<%s>",
                        imap->uid,
                        imap->section ? imap->section : "",
                        imap->partial);
  else
    result = imap_sendf(conn, "FETCH %s BODY[%s]",
                        imap->uid,
                        imap->section ? imap->section : "");

  if(!result)
    state(conn, IMAP_FETCH);

  return result;
}